

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_lcall_real_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip1,int shift,int next_eip)

{
  uint32_t uVar1;
  target_ulong tVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uintptr_t unaff_retaddr;
  
  iVar4 = (int)env->regs[4];
  uVar7 = env->segs[2].flags;
  uVar6 = -(uint)((uVar7 >> 0x16 & 1) != 0) | 0xffff;
  if ((uVar7 >> 0x15 & 1) != 0) {
    uVar6 = 0;
  }
  tVar2 = env->segs[2].base;
  if (shift == 0) {
    uVar1 = env->segs[1].selector;
    iVar3 = cpu_mmu_index_kernel(env);
    cpu_stw_mmuidx_ra_x86_64(env,(iVar4 - 2U & uVar6) + tVar2,uVar1,iVar3,unaff_retaddr);
    uVar7 = iVar4 - 4;
    iVar4 = cpu_mmu_index_kernel(env);
    cpu_stw_mmuidx_ra_x86_64(env,(uVar6 & uVar7) + tVar2,next_eip,iVar4,unaff_retaddr);
  }
  else {
    uVar1 = env->segs[1].selector;
    iVar3 = cpu_mmu_index_kernel(env);
    cpu_stl_mmuidx_ra_x86_64
              (env,(ulong)((iVar4 - 4U & uVar6) + (int)tVar2),uVar1,iVar3,unaff_retaddr);
    uVar7 = iVar4 - 8;
    iVar4 = cpu_mmu_index_kernel(env);
    cpu_stl_mmuidx_ra_x86_64(env,(ulong)((uVar6 & uVar7) + (int)tVar2),next_eip,iVar4,unaff_retaddr)
    ;
  }
  if ((uVar6 == 0xffffffff) || (uVar6 != 0xffff)) {
    uVar5 = (ulong)uVar7;
  }
  else {
    uVar5 = (ulong)(uVar7 & 0xffff) | env->regs[4] & 0xffffffffffff0000;
  }
  env->regs[4] = uVar5;
  env->eip = (long)(int)new_eip1;
  env->segs[1].selector = new_cs;
  env->segs[1].base = (long)(new_cs << 4);
  return;
}

Assistant:

void helper_lcall_real(CPUX86State *env, int new_cs, target_ulong new_eip1,
                       int shift, int next_eip)
{
    int new_eip;
    uint32_t esp, esp_mask;
    target_ulong ssp;

    new_eip = new_eip1;
    esp = env->regs[R_ESP];
    esp_mask = get_sp_mask(env->segs[R_SS].flags);
    ssp = env->segs[R_SS].base;
    if (shift) {
        PUSHL_RA(ssp, esp, esp_mask, env->segs[R_CS].selector, GETPC());
        PUSHL_RA(ssp, esp, esp_mask, next_eip, GETPC());
    } else {
        PUSHW_RA(ssp, esp, esp_mask, env->segs[R_CS].selector, GETPC());
        PUSHW_RA(ssp, esp, esp_mask, next_eip, GETPC());
    }

    SET_ESP(esp, esp_mask);
    env->eip = new_eip;
    env->segs[R_CS].selector = new_cs;
    env->segs[R_CS].base = (new_cs << 4);
}